

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addMiniBatchSize<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,OptimizerTypeCase optimizerType,int64_t defaultValue,
               int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  SGDOptimizer *this_01;
  Int64Parameter *this_02;
  AdamOptimizer *this_03;
  Int64Set *this_04;
  _Base_ptr p_Var1;
  Int64Range *pIVar2;
  
  this = CoreML::Specification::NeuralNetwork::_internal_mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::_internal_mutable_optimizer(this);
  if (optimizerType == kAdamOptimizer) {
    this_03 = CoreML::Specification::Optimizer::_internal_mutable_adamoptimizer(this_00);
    this_02 = CoreML::Specification::AdamOptimizer::_internal_mutable_minibatchsize(this_03);
  }
  else if (optimizerType == kSgdOptimizer) {
    this_01 = CoreML::Specification::Optimizer::_internal_mutable_sgdoptimizer(this_00);
    this_02 = CoreML::Specification::SGDOptimizer::_internal_mutable_minibatchsize(this_01);
  }
  else {
    this_02 = (Int64Parameter *)0x0;
  }
  this_02->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar2 = CoreML::Specification::Int64Parameter::_internal_mutable_range(this_02);
    pIVar2->minvalue_ = minValue;
    pIVar2->maxvalue_ = maxValue;
  }
  else {
    this_04 = CoreML::Specification::Int64Parameter::_internal_mutable_set(this_02);
    for (p_Var1 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      CoreML::Specification::Int64Set::_internal_add_values(this_04,*(int64_t *)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void addMiniBatchSize(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    
    Specification::Int64Parameter *miniBatchSize = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            miniBatchSize = optimizer->mutable_sgdoptimizer()->mutable_minibatchsize();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            miniBatchSize = optimizer->mutable_adamoptimizer()->mutable_minibatchsize();
            break;
        default:
            break;
    }
    
    miniBatchSize->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = miniBatchSize->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = miniBatchSize->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}